

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_single.h
# Opt level: O2

bool __thiscall
density::detail::
LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
::Consume::begin_iteration
          (Consume *this,
          LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          *i_queue)

{
  uintptr_t uVar1;
  ControlBlock *i_atomic;
  
  i_atomic = i_queue->m_head;
  if (i_atomic == (ControlBlock *)0x0) {
    i_atomic = (i_queue->
               super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
               ).m_initial_page._M_b._M_p;
    i_queue->m_head = i_atomic;
    if (i_atomic == (ControlBlock *)0x0) {
      uVar1 = 0;
      goto LAB_00ec9d29;
    }
  }
  this->m_queue = i_queue;
  this->m_control = i_atomic;
  uVar1 = raw_atomic_load(&i_atomic->m_next,memory_order_seq_cst);
LAB_00ec9d29:
  this->m_next_ptr = uVar1;
  return true;
}

Assistant:

bool begin_iteration(LFQueue_Head * i_queue) noexcept
                {
                    DENSITY_ASSUME_ALIGNED(m_control, Base::s_alloc_granularity);

                    DENSITY_ASSUME_ALIGNED(i_queue->m_head, Base::s_alloc_granularity);

                    if (i_queue->m_head == nullptr)
                    {
                        i_queue->m_head = i_queue->Base::get_initial_page();
                        if (i_queue->m_head == nullptr)
                        {
                            m_next_ptr = 0;
                            return true;
                        }
                    }

                    m_queue    = i_queue;
                    m_control  = static_cast<ControlBlock *>(i_queue->m_head);
                    m_next_ptr = raw_atomic_load(&m_control->m_next, mem_acquire);
                    return true;
                }